

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O0

wchar_t borg_launch_bolt(wchar_t rad,wchar_t dam,wchar_t typ,wchar_t max,wchar_t ammo_location)

{
  loc t;
  chunk_conflict *c;
  _Bool _Var1;
  wchar_t x_00;
  wchar_t y_00;
  wchar_t wVar3;
  loc_conflict grid;
  loc lVar4;
  wchar_t wVar2;
  loc lVar5;
  wchar_t y;
  wchar_t x;
  wchar_t b_d;
  wchar_t d;
  wchar_t o_x;
  wchar_t o_y;
  wchar_t b_o_x;
  wchar_t b_o_y;
  wchar_t b_n;
  wchar_t n;
  wchar_t b_i;
  wchar_t i;
  wchar_t ammo_location_local;
  wchar_t max_local;
  wchar_t typ_local;
  wchar_t dam_local;
  wchar_t rad_local;
  
  b_n = L'\xffffffff';
  b_o_x = L'\xffffffff';
  o_y = L'\0';
  o_x = L'\0';
  y = (wchar_t)z_info->max_range;
  for (n = L'\0'; n < borg_temp_n; n = n + L'\x01') {
    for (b_d = L'\xffffffff'; b_d < L'\x02'; b_d = b_d + L'\x01') {
      for (d = L'\xffffffff'; c = cave, d < L'\x02'; d = d + L'\x01') {
        x_00 = (uint)borg_temp_x[n] + b_d;
        y_00 = (uint)borg_temp_y[n] + d;
        borg_tp_other_n = 0;
        b_o_y = L'\0';
        grid = (loc_conflict)loc(x_00,y_00);
        _Var1 = square_in_bounds((chunk *)c,grid);
        if (_Var1) {
          lVar4 = loc((uint)borg_temp_x[n],(uint)borg_temp_y[n]);
          lVar5.y = borg.c.y;
          lVar5.x = borg.c.x;
          wVar2 = distance(lVar5,lVar4);
          if (((x_00 == (uint)borg_temp_x[n]) && (y_00 == (uint)borg_temp_y[n])) || (typ != L'-')) {
            lVar5 = loc(x_00,y_00);
            lVar4.y = borg.c.y;
            lVar4.x = borg.c.x;
            wVar3 = distance(lVar4,lVar5);
            if (wVar3 <= max) {
              if (((L'\x01' < rad) && (borg_grids[y_00][x_00].feat != '\0')) ||
                 ((y_00 == (uint)borg_temp_y[n] && (x_00 == (uint)borg_temp_x[n])))) {
                b_o_y = borg_launch_bolt_at_location(y_00,x_00,rad,dam,typ,max,ammo_location);
              }
              if ((typ == L'-') && (L'\0' < b_o_y)) {
                wVar3 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
                b_o_y = dam - wVar3;
              }
              borg_tp_other_n = 0;
              if ((((((L'\0' < b_o_y) && (x_00 != L'\0')) && (y_00 != L'\0')) &&
                   ((x_00 != L'Å' && (y_00 != L'A')))) && ((b_n < L'\0' || (b_o_x <= b_o_y)))) &&
                 ((b_o_y != b_o_x || (wVar2 <= y)))) {
                b_n = n;
                b_o_x = b_o_y;
                o_y = d;
                o_x = b_d;
                y = wVar2;
              }
            }
          }
        }
      }
    }
  }
  if ((b_n != L'\xffffffff') && (borg_tp_other_n = 0, (borg_simulate & 1U) == 0)) {
    borg.goal.g.x = (uint)borg_temp_x[b_n] + o_x;
    borg.goal.g.y = (uint)borg_temp_y[b_n] + o_y;
    t.y = borg.goal.g.y;
    t.x = borg.goal.g.x;
    borg_target(t);
  }
  return b_o_x;
}

Assistant:

int borg_launch_bolt(int rad, int dam, int typ, int max, int ammo_location)
{
    int i     = 0;
    int b_i   = -1;
    int n     = 0;
    int b_n   = -1;
    int b_o_y = 0, b_o_x = 0;
    int o_y = 0, o_x = 0;
    int d, b_d       = z_info->max_range;

    /* Examine possible destinations */

    /* This will allow the borg to target places adjacent to a monster
     * in order to exploit and abuse a feature of the game.  Whereas,
     * the borg, while targeting a monster will not score d/t walls, he
     * could land a successful hit by targeting adjacent to the monster.
     * For example:
     * ######################
     * #####....@......######
     * ############Px........
     * ######################
     * In order to hit the P, the borg must target the x and not the P.
     *
     */
    for (i = 0; i < borg_temp_n; i++) {
        int x = borg_temp_x[i];
        int y = borg_temp_y[i];

        /* Consider each adjacent spot to and on top of the monster */
        for (o_x = -1; o_x <= 1; o_x++) {
            for (o_y = -1; o_y <= 1; o_y++) {
                /* Acquire location */
                x = borg_temp_x[i] + o_x;
                y = borg_temp_y[i] + o_y;

                /* Reset Teleport Other variables */
                borg_tp_other_n = 0;
                n               = 0;

                /* Bounds check */
                if (!square_in_bounds(cave, loc(x, y)))
                    continue;

                /* Remember how far away the monster is */
                d = distance(borg.c, loc(borg_temp_x[i], borg_temp_y[i]));

                /* Skip certain types of Offset attacks */
                if ((x != borg_temp_x[i] || y != borg_temp_y[i])
                    && typ == BORG_ATTACK_AWAY_ALL)
                    continue;

                /* Skip places that are out of range */
                if (distance(borg.c, loc(x, y)) > max)
                    continue;

                /* Consider it if its a ball spell or right on top of it */
                if ((rad >= 2 && borg_grids[y][x].feat != FEAT_NONE)
                    || (y == borg_temp_y[i] && x == borg_temp_x[i]))
                    n = borg_launch_bolt_at_location(
                        y, x, rad, dam, typ, max, ammo_location);

                /* Teleport Other is now considered */
                if (typ == BORG_ATTACK_AWAY_ALL && n > 0) {
                    /* Consider danger with certain monsters removed
                     * from the danger check.  They were removed from the list
                     * of considered monsters (borg_tp_other array)
                     */
                    n = borg_danger(borg.c.y, borg.c.x, 1, true, false);

                    /* since this is the danger after monster removal */
                    /* and dam for tel away is the previous danger */
                    /* we want the biggest reduction in danger */
                    n = dam - n;
                }

                /* Reset Teleport Other variables */
                borg_tp_other_n = 0;

                /* Skip useless attacks */
                if (n <= 0)
                    continue;

                /* The game forbids targetting the outside walls */
                if (x == 0 || y == 0 || x == DUNGEON_WID - 1
                    || y == DUNGEON_HGT - 1)
                    continue;

                /* Collect best attack */
                if ((b_i >= 0) && (n < b_n))
                    continue;

                /* Skip attacking farther monster if rewards are equal. */
                if (n == b_n && d > b_d)
                    continue;

                /* Track it */
                b_i   = i;
                b_n   = n;
                b_o_y = o_y;
                b_o_x = o_x;
                b_d   = d;
            }
        }
    }
    if (b_i == -1)
        return b_n;

    /* Reset Teleport Other variables */
    borg_tp_other_n = 0;

    /* Simulation */
    if (borg_simulate)
        return b_n;

    /* Save the location */
    borg.goal.g.x = borg_temp_x[b_i] + b_o_x;
    borg.goal.g.y = borg_temp_y[b_i] + b_o_y;

    /* Target the location */
    (void)borg_target(borg.goal.g);

    /* Result */
    return b_n;
}